

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# byte_string.hpp
# Opt level: O2

type_conflict2
jsoncons::detail::encode_base64_generic<unsigned_char_const*,std::__cxx11::string>
          (uchar *first,uchar *last,char *alphabet,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *result)

{
  char cVar1;
  ulong uVar2;
  long lVar3;
  type_conflict2 tVar4;
  long lVar5;
  char cVar6;
  ulong uVar7;
  long lVar8;
  long lStack_50;
  uchar uStack_41;
  uchar a3 [3];
  uchar a4 [4];
  
  cVar1 = alphabet[0x40];
  lVar3 = 0;
  tVar4 = 0;
  lStack_50 = 1;
  while( true ) {
    lVar8 = lStack_50;
    cVar6 = (char)result;
    if (first + lVar8 + -1 == last) break;
    a3[lVar8 + -1] = first[lVar8 + -1];
    lStack_50 = lVar8 + 1;
    if ((int)(lVar8 + 1) == 4) {
      first = first + lVar8;
      for (lVar8 = 0; lVar8 != 4; lVar8 = lVar8 + 1) {
        std::__cxx11::string::push_back(cVar6);
      }
      tVar4 = tVar4 + 4;
      lVar3 = lVar3 + -4;
      lStack_50 = 1;
    }
  }
  if ((int)lVar8 != 1) {
    uVar7 = lVar8 - 1;
    for (uVar2 = uVar7; lVar5 = lVar8, (int)uVar2 < 3; uVar2 = uVar2 + 1) {
      a3[uVar2] = '\0';
    }
    while (lVar5 != 0) {
      std::__cxx11::string::push_back(cVar6);
      lVar5 = lVar5 + -1;
    }
    tVar4 = lVar8 - lVar3;
    if (cVar1 != '\0') {
      for (; (uint)uVar7 < 3; uVar7 = (ulong)((uint)uVar7 + 1)) {
        std::__cxx11::string::push_back(cVar6);
        tVar4 = tVar4 + 1;
      }
    }
  }
  return tVar4;
}

Assistant:

typename std::enable_if<std::is_same<typename std::iterator_traits<InputIt>::value_type,uint8_t>::value,size_t>::type
    encode_base64_generic(InputIt first, InputIt last, const char alphabet[65], Container& result)
    {
        std::size_t count = 0;
        unsigned char a3[3];
        unsigned char a4[4];
        unsigned char fill = alphabet[64];
        int i = 0;
        int j = 0;

        while (first != last)
        {
            a3[i++] = *first++;
            if (i == 3)
            {
                a4[0] = (a3[0] & 0xfc) >> 2;
                a4[1] = ((a3[0] & 0x03) << 4) + ((a3[1] & 0xf0) >> 4);
                a4[2] = ((a3[1] & 0x0f) << 2) + ((a3[2] & 0xc0) >> 6);
                a4[3] = a3[2] & 0x3f;

                for (i = 0; i < 4; i++) 
                {
                    result.push_back(alphabet[a4[i]]);
                    ++count;
                }
                i = 0;
            }
        }

        if (i > 0)
        {
            for (j = i; j < 3; ++j) 
            {
                a3[j] = 0;
            }

            a4[0] = (a3[0] & 0xfc) >> 2;
            a4[1] = ((a3[0] & 0x03) << 4) + ((a3[1] & 0xf0) >> 4);
            a4[2] = ((a3[1] & 0x0f) << 2) + ((a3[2] & 0xc0) >> 6);

            for (j = 0; j < i + 1; ++j) 
            {
                result.push_back(alphabet[a4[j]]);
                ++count;
            }

            if (fill != 0)
            {
                while (i++ < 3) 
                {
                    result.push_back(fill);
                    ++count;
                }
            }
        }

        return count;
    }